

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skiplist_tests.cpp
# Opt level: O3

void __thiscall
skiplist_tests::findearliestatleast_edge_test::test_method(findearliestatleast_edge_test *this)

{
  undefined4 uVar1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  iterator __tmp;
  _List_node_base *p_Var4;
  CBlockIndex *pCVar5;
  int iVar6;
  iterator in_R8;
  iterator pvVar7;
  iterator in_R9;
  iterator pvVar8;
  long lVar9;
  _List_node_base *p_Var10;
  iterator __tmp_1;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string file_14;
  const_string file_15;
  const_string file_16;
  const_string file_17;
  const_string file_18;
  const_string file_19;
  const_string file_20;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  const_string msg_17;
  const_string msg_18;
  const_string msg_19;
  const_string msg_20;
  check_type cVar11;
  char *local_450;
  char *local_448;
  undefined1 *local_440;
  undefined1 *local_438;
  char *local_430;
  char *local_428;
  char *local_420;
  char *local_418;
  undefined1 *local_410;
  undefined1 *local_408;
  char *local_400;
  char *local_3f8;
  char *local_3f0;
  char *local_3e8;
  undefined1 *local_3e0;
  undefined1 *local_3d8;
  char *local_3d0;
  char *local_3c8;
  char *local_3c0;
  char *local_3b8;
  undefined1 *local_3b0;
  undefined1 *local_3a8;
  char *local_3a0;
  char *local_398;
  undefined1 *local_390;
  undefined1 *local_388;
  char *local_380;
  char *local_378;
  undefined1 *local_370;
  undefined1 *local_368;
  char *local_360;
  char *local_358;
  undefined1 *local_350;
  undefined1 *local_348;
  char *local_340;
  char *local_338;
  undefined1 *local_330;
  undefined1 *local_328;
  char *local_320;
  char *local_318;
  char *local_310;
  char *local_308;
  undefined1 *local_300;
  undefined1 *local_2f8;
  char *local_2f0;
  char *local_2e8;
  char *local_2e0;
  char *local_2d8;
  undefined1 *local_2d0;
  undefined1 *local_2c8;
  char *local_2c0;
  char *local_2b8;
  char *local_2b0;
  char *local_2a8;
  undefined1 *local_2a0;
  undefined1 *local_298;
  char *local_290;
  char *local_288;
  undefined1 *local_280;
  undefined1 *local_278;
  char *local_270;
  char *local_268;
  undefined1 *local_260;
  undefined1 *local_258;
  char *local_250;
  char *local_248;
  undefined1 *local_240;
  undefined1 *local_238;
  char *local_230;
  char *local_228;
  undefined1 *local_220;
  undefined1 *local_218;
  char *local_210;
  char *local_208;
  char *local_200;
  char *local_1f8;
  undefined1 *local_1f0;
  undefined1 *local_1e8;
  char *local_1e0;
  char *local_1d8;
  undefined1 *local_1d0;
  undefined1 *local_1c8;
  char *local_1c0;
  char *local_1b8;
  undefined1 *local_1b0;
  undefined1 *local_1a8;
  char *local_1a0;
  char *local_198;
  undefined1 *local_190;
  undefined1 *local_188;
  char *local_180;
  char *local_178;
  undefined1 *local_170;
  undefined1 *local_168;
  char *local_160;
  char *local_158;
  undefined1 *local_150;
  undefined1 *local_148;
  char *local_140;
  char *local_138;
  undefined4 local_12c;
  undefined1 local_128 [16];
  undefined1 *local_118;
  char *local_110;
  undefined1 *local_108;
  undefined1 *local_100;
  char *local_f8;
  char *local_f0;
  CChain chain;
  list<CBlockIndex,_std::allocator<CBlockIndex>_> blocks;
  undefined4 *local_b0;
  assertion_result local_a8;
  undefined4 **local_90;
  int *local_88;
  lazy_ostream local_80;
  undefined1 *local_70;
  lazy_ostream *local_68;
  char *local_60;
  char *local_58;
  assertion_result local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  blocks.super__List_base<CBlockIndex,_std::allocator<CBlockIndex>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&blocks;
  blocks.super__List_base<CBlockIndex,_std::allocator<CBlockIndex>_>._M_impl._M_node._M_size = 0;
  lVar9 = 0;
  blocks.super__List_base<CBlockIndex,_std::allocator<CBlockIndex>_>._M_impl._M_node.
  super__List_node_base._M_prev =
       blocks.super__List_base<CBlockIndex,_std::allocator<CBlockIndex>_>._M_impl._M_node.
       super__List_node_base._M_next;
  do {
    p_Var2 = blocks.super__List_base<CBlockIndex,_std::allocator<CBlockIndex>_>._M_impl._M_node.
             super__List_node_base._M_prev;
    p_Var3 = blocks.super__List_base<CBlockIndex,_std::allocator<CBlockIndex>_>._M_impl._M_node.
             super__List_node_base._M_next;
    uVar1 = *(undefined4 *)((long)&DAT_00f1cc08 + lVar9);
    p_Var10 = (_List_node_base *)0x0;
    if (blocks.super__List_base<CBlockIndex,_std::allocator<CBlockIndex>_>._M_impl._M_node.
        super__List_node_base._M_next != (_List_node_base *)&blocks) {
      p_Var10 = blocks.super__List_base<CBlockIndex,_std::allocator<CBlockIndex>_>._M_impl._M_node.
                super__List_node_base._M_prev + 1;
    }
    p_Var4 = (_List_node_base *)operator_new(0xa8);
    iVar6 = 0;
    memset(p_Var4 + 1,0,0x98);
    std::__detail::_List_node_base::_M_hook(p_Var4);
    blocks.super__List_base<CBlockIndex,_std::allocator<CBlockIndex>_>._M_impl._M_node._M_size =
         blocks.super__List_base<CBlockIndex,_std::allocator<CBlockIndex>_>._M_impl._M_node._M_size
         + 1;
    if (p_Var3 != (_List_node_base *)&blocks) {
      iVar6 = *(int *)&p_Var2[2]._M_prev + 1;
    }
    *(int *)&blocks.super__List_base<CBlockIndex,_std::allocator<CBlockIndex>_>._M_impl._M_node.
             super__List_node_base._M_prev[2]._M_prev = iVar6;
    blocks.super__List_base<CBlockIndex,_std::allocator<CBlockIndex>_>._M_impl._M_node.
    super__List_node_base._M_prev[1]._M_prev = p_Var10;
    CBlockIndex::BuildSkip
              ((CBlockIndex *)
               (blocks.super__List_base<CBlockIndex,_std::allocator<CBlockIndex>_>._M_impl._M_node.
                super__List_node_base._M_prev + 1));
    *(undefined4 *)
     &blocks.super__List_base<CBlockIndex,_std::allocator<CBlockIndex>_>._M_impl._M_node.
      super__List_node_base._M_prev[10]._M_next = uVar1;
    lVar9 = lVar9 + 4;
  } while (lVar9 != 0x24);
  chain.vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  chain.vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  chain.vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  CChain::SetTip(&chain,(CBlockIndex *)
                        (blocks.super__List_base<CBlockIndex,_std::allocator<CBlockIndex>_>._M_impl.
                         _M_node.super__List_node_base._M_prev + 1));
  local_f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/skiplist_tests.cpp"
  ;
  local_f0 = "";
  local_108 = &boost::unit_test::basic_cstring<char_const>::null;
  local_100 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0xa1;
  file.m_begin = (iterator)&local_f8;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_108,msg);
  local_128._8_8_ = local_128._8_8_ & 0xffffffffffffff00;
  local_128._0_8_ = &PTR__lazy_ostream_01388f08;
  local_118 = boost::unit_test::lazy_ostream::inst;
  local_110 = "";
  pCVar5 = CChain::FindEarliestAtLeast(&chain,0x32,0);
  local_88 = &pCVar5->nHeight;
  local_b0 = &local_12c;
  local_12c = 0;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(pCVar5->nHeight == 0);
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/skiplist_tests.cpp"
  ;
  local_58 = "";
  local_68 = (lazy_ostream *)&local_88;
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013890c8;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  local_a8.m_message.px = (element_type *)((ulong)local_a8.m_message.px & 0xffffffffffffff00);
  local_a8._0_8_ = &PTR__lazy_ostream_013890c8;
  local_a8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  pvVar7 = (iterator)0x1;
  pvVar8 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,(lazy_ostream *)local_128,1,2,REQUIRE,0xf1c7ee,(size_t)&local_60,0xa1,
             &local_80,"0",&local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_140 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/skiplist_tests.cpp"
  ;
  local_138 = "";
  local_150 = &boost::unit_test::basic_cstring<char_const>::null;
  local_148 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0xa2;
  file_00.m_begin = (iterator)&local_140;
  msg_00.m_end = pvVar8;
  msg_00.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_150,
             msg_00);
  local_128._8_8_ = local_128._8_8_ & 0xffffffffffffff00;
  local_128._0_8_ = &PTR__lazy_ostream_01388f08;
  local_118 = boost::unit_test::lazy_ostream::inst;
  local_110 = "";
  pCVar5 = CChain::FindEarliestAtLeast(&chain,100,0);
  local_88 = &pCVar5->nHeight;
  local_12c = 0;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(pCVar5->nHeight == 0);
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/skiplist_tests.cpp"
  ;
  local_58 = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013890c8;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = (lazy_ostream *)&local_88;
  local_b0 = &local_12c;
  local_a8.m_message.px = (element_type *)((ulong)local_a8.m_message.px & 0xffffffffffffff00);
  local_a8._0_8_ = &PTR__lazy_ostream_013890c8;
  local_a8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  pvVar7 = (iterator)0x1;
  pvVar8 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,(lazy_ostream *)local_128,1,2,REQUIRE,0xf1c818,(size_t)&local_60,0xa2,
             &local_80,"0",&local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_160 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/skiplist_tests.cpp"
  ;
  local_158 = "";
  local_170 = &boost::unit_test::basic_cstring<char_const>::null;
  local_168 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0xa3;
  file_01.m_begin = (iterator)&local_160;
  msg_01.m_end = pvVar8;
  msg_01.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_170,
             msg_01);
  local_128._8_8_ = local_128._8_8_ & 0xffffffffffffff00;
  local_128._0_8_ = &PTR__lazy_ostream_01388f08;
  local_118 = boost::unit_test::lazy_ostream::inst;
  local_110 = "";
  pCVar5 = CChain::FindEarliestAtLeast(&chain,0x96,0);
  local_88 = &pCVar5->nHeight;
  local_12c = 3;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(pCVar5->nHeight == 3);
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/skiplist_tests.cpp"
  ;
  local_58 = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013890c8;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = (lazy_ostream *)&local_88;
  local_b0 = &local_12c;
  local_a8.m_message.px = (element_type *)((ulong)local_a8.m_message.px & 0xffffffffffffff00);
  local_a8._0_8_ = &PTR__lazy_ostream_013890c8;
  local_a8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  pvVar7 = (iterator)0x1;
  pvVar8 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,(lazy_ostream *)local_128,1,2,REQUIRE,0xf1c843,(size_t)&local_60,0xa3,
             &local_80,"3",&local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_180 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/skiplist_tests.cpp"
  ;
  local_178 = "";
  local_190 = &boost::unit_test::basic_cstring<char_const>::null;
  local_188 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0xa4;
  file_02.m_begin = (iterator)&local_180;
  msg_02.m_end = pvVar8;
  msg_02.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_190,
             msg_02);
  local_128._8_8_ = local_128._8_8_ & 0xffffffffffffff00;
  local_128._0_8_ = &PTR__lazy_ostream_01388f08;
  local_118 = boost::unit_test::lazy_ostream::inst;
  local_110 = "";
  pCVar5 = CChain::FindEarliestAtLeast(&chain,200,0);
  local_88 = &pCVar5->nHeight;
  local_12c = 3;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(pCVar5->nHeight == 3);
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/skiplist_tests.cpp"
  ;
  local_58 = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013890c8;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = (lazy_ostream *)&local_88;
  local_b0 = &local_12c;
  local_a8.m_message.px = (element_type *)((ulong)local_a8.m_message.px & 0xffffffffffffff00);
  local_a8._0_8_ = &PTR__lazy_ostream_013890c8;
  local_a8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  pvVar7 = (iterator)0x1;
  pvVar8 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,(lazy_ostream *)local_128,1,2,REQUIRE,0xf1c86e,(size_t)&local_60,0xa4,
             &local_80,"3",&local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_1a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/skiplist_tests.cpp"
  ;
  local_198 = "";
  local_1b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0xa5;
  file_03.m_begin = (iterator)&local_1a0;
  msg_03.m_end = pvVar8;
  msg_03.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_1b0,
             msg_03);
  local_128._8_8_ = local_128._8_8_ & 0xffffffffffffff00;
  local_128._0_8_ = &PTR__lazy_ostream_01388f08;
  local_118 = boost::unit_test::lazy_ostream::inst;
  local_110 = "";
  pCVar5 = CChain::FindEarliestAtLeast(&chain,0xfa,0);
  local_88 = &pCVar5->nHeight;
  local_12c = 6;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(pCVar5->nHeight == 6);
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/skiplist_tests.cpp"
  ;
  local_58 = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013890c8;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = (lazy_ostream *)&local_88;
  local_b0 = &local_12c;
  local_a8.m_message.px = (element_type *)((ulong)local_a8.m_message.px & 0xffffffffffffff00);
  local_a8._0_8_ = &PTR__lazy_ostream_013890c8;
  local_a8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  pvVar7 = (iterator)0x1;
  pvVar8 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,(lazy_ostream *)local_128,1,2,REQUIRE,0xf1c899,(size_t)&local_60,0xa5,
             &local_80,"6",&local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_1c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/skiplist_tests.cpp"
  ;
  local_1b8 = "";
  local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1c8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0xa6;
  file_04.m_begin = (iterator)&local_1c0;
  msg_04.m_end = pvVar8;
  msg_04.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_1d0,
             msg_04);
  local_128._8_8_ = local_128._8_8_ & 0xffffffffffffff00;
  local_128._0_8_ = &PTR__lazy_ostream_01388f08;
  local_118 = boost::unit_test::lazy_ostream::inst;
  local_110 = "";
  pCVar5 = CChain::FindEarliestAtLeast(&chain,300,0);
  local_88 = &pCVar5->nHeight;
  local_12c = 6;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(pCVar5->nHeight == 6);
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/skiplist_tests.cpp"
  ;
  local_58 = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013890c8;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = (lazy_ostream *)&local_88;
  local_b0 = &local_12c;
  local_a8.m_message.px = (element_type *)((ulong)local_a8.m_message.px & 0xffffffffffffff00);
  local_a8._0_8_ = &PTR__lazy_ostream_013890c8;
  local_a8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  pvVar7 = (iterator)0x1;
  pvVar8 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,(lazy_ostream *)local_128,1,2,REQUIRE,0xf1c8c4,(size_t)&local_60,0xa6,
             &local_80,"6",&local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_1e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/skiplist_tests.cpp"
  ;
  local_1d8 = "";
  local_1f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1e8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0xa7;
  file_05.m_begin = (iterator)&local_1e0;
  msg_05.m_end = pvVar8;
  msg_05.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_1f0,
             msg_05);
  _cVar11 = 0x63aa0e;
  pCVar5 = CChain::FindEarliestAtLeast(&chain,0x15e,0);
  local_a8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(pCVar5 == (CBlockIndex *)0x0);
  local_a8.m_message.px = (element_type *)0x0;
  local_a8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_128._0_8_ = "!chain.FindEarliestAtLeast(350, 0)";
  local_128._8_8_ = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01389048;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_200 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/skiplist_tests.cpp"
  ;
  local_1f8 = "";
  pvVar7 = (iterator)0x1;
  pvVar8 = (iterator)0x0;
  local_68 = (lazy_ostream *)local_128;
  boost::test_tools::tt_detail::report_assertion
            (&local_a8,&local_80,1,0,WARN,_cVar11,(size_t)&local_200,0xa7);
  boost::detail::shared_count::~shared_count(&local_a8.m_message.pn);
  local_210 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/skiplist_tests.cpp"
  ;
  local_208 = "";
  local_220 = &boost::unit_test::basic_cstring<char_const>::null;
  local_218 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0xa9;
  file_06.m_begin = (iterator)&local_210;
  msg_06.m_end = pvVar8;
  msg_06.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_220,
             msg_06);
  local_128._8_8_ = local_128._8_8_ & 0xffffffffffffff00;
  local_128._0_8_ = &PTR__lazy_ostream_01388f08;
  local_118 = boost::unit_test::lazy_ostream::inst;
  local_110 = "";
  pCVar5 = CChain::FindEarliestAtLeast(&chain,0,0);
  local_88 = &pCVar5->nHeight;
  local_12c = 0;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(pCVar5->nHeight == 0);
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/skiplist_tests.cpp"
  ;
  local_58 = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013890c8;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = (lazy_ostream *)&local_88;
  local_b0 = &local_12c;
  local_a8.m_message.px = (element_type *)((ulong)local_a8.m_message.px & 0xffffffffffffff00);
  local_a8._0_8_ = &PTR__lazy_ostream_013890c8;
  local_a8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  pvVar7 = (iterator)0x1;
  pvVar8 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,(lazy_ostream *)local_128,1,2,REQUIRE,0xf1c912,(size_t)&local_60,0xa9,
             &local_80,"0",&local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_230 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/skiplist_tests.cpp"
  ;
  local_228 = "";
  local_240 = &boost::unit_test::basic_cstring<char_const>::null;
  local_238 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0xaa;
  file_07.m_begin = (iterator)&local_230;
  msg_07.m_end = pvVar8;
  msg_07.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_240,
             msg_07);
  local_128._8_8_ = local_128._8_8_ & 0xffffffffffffff00;
  local_128._0_8_ = &PTR__lazy_ostream_01388f08;
  local_118 = boost::unit_test::lazy_ostream::inst;
  local_110 = "";
  pCVar5 = CChain::FindEarliestAtLeast(&chain,-1,0);
  local_88 = &pCVar5->nHeight;
  local_12c = 0;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(pCVar5->nHeight == 0);
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/skiplist_tests.cpp"
  ;
  local_58 = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013890c8;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = (lazy_ostream *)&local_88;
  local_b0 = &local_12c;
  local_a8.m_message.px = (element_type *)((ulong)local_a8.m_message.px & 0xffffffffffffff00);
  local_a8._0_8_ = &PTR__lazy_ostream_013890c8;
  local_a8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  pvVar7 = (iterator)0x1;
  pvVar8 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,(lazy_ostream *)local_128,1,2,REQUIRE,0xf1c93b,(size_t)&local_60,0xaa,
             &local_80,"0",&local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_250 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/skiplist_tests.cpp"
  ;
  local_248 = "";
  local_260 = &boost::unit_test::basic_cstring<char_const>::null;
  local_258 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0xac;
  file_08.m_begin = (iterator)&local_250;
  msg_08.m_end = pvVar8;
  msg_08.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_260,
             msg_08);
  local_128._8_8_ = local_128._8_8_ & 0xffffffffffffff00;
  local_128._0_8_ = &PTR__lazy_ostream_01388f08;
  local_118 = boost::unit_test::lazy_ostream::inst;
  local_110 = "";
  pCVar5 = CChain::FindEarliestAtLeast(&chain,-0x8000000000000000,0);
  local_88 = &pCVar5->nHeight;
  local_12c = 0;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(pCVar5->nHeight == 0);
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/skiplist_tests.cpp"
  ;
  local_58 = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013890c8;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = (lazy_ostream *)&local_88;
  local_b0 = &local_12c;
  local_a8.m_message.px = (element_type *)((ulong)local_a8.m_message.px & 0xffffffffffffff00);
  local_a8._0_8_ = &PTR__lazy_ostream_013890c8;
  local_a8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  pvVar7 = (iterator)0x1;
  pvVar8 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,(lazy_ostream *)local_128,1,2,REQUIRE,0xf1c965,(size_t)&local_60,0xac,
             &local_80,"0",&local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_270 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/skiplist_tests.cpp"
  ;
  local_268 = "";
  local_280 = &boost::unit_test::basic_cstring<char_const>::null;
  local_278 = &boost::unit_test::basic_cstring<char_const>::null;
  file_09.m_end = (iterator)0xad;
  file_09.m_begin = (iterator)&local_270;
  msg_09.m_end = pvVar8;
  msg_09.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_280,
             msg_09);
  local_128._8_8_ = local_128._8_8_ & 0xffffffffffffff00;
  local_128._0_8_ = &PTR__lazy_ostream_01388f08;
  local_118 = boost::unit_test::lazy_ostream::inst;
  local_110 = "";
  pCVar5 = CChain::FindEarliestAtLeast(&chain,-0x100000000,0);
  local_88 = &pCVar5->nHeight;
  local_12c = 0;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(pCVar5->nHeight == 0);
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/skiplist_tests.cpp"
  ;
  local_58 = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013890c8;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = (lazy_ostream *)&local_88;
  local_b0 = &local_12c;
  local_a8.m_message.px = (element_type *)((ulong)local_a8.m_message.px & 0xffffffffffffff00);
  local_a8._0_8_ = &PTR__lazy_ostream_013890c8;
  local_a8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  pvVar7 = (iterator)0x1;
  pvVar8 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,(lazy_ostream *)local_128,1,2,REQUIRE,0xf1c9b0,(size_t)&local_60,0xad,
             &local_80,"0",&local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_290 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/skiplist_tests.cpp"
  ;
  local_288 = "";
  local_2a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_298 = &boost::unit_test::basic_cstring<char_const>::null;
  file_10.m_end = (iterator)0xae;
  file_10.m_begin = (iterator)&local_290;
  msg_10.m_end = pvVar8;
  msg_10.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_2a0,
             msg_10);
  _cVar11 = 0x63b0b2;
  pCVar5 = CChain::FindEarliestAtLeast(&chain,0x7fffffffffffffff,0);
  local_a8.m_message.px = (element_type *)0x0;
  local_a8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_128._0_8_ = "!chain.FindEarliestAtLeast(std::numeric_limits<int64_t>::max(), 0)";
  local_128._8_8_ = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01389048;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_2b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/skiplist_tests.cpp"
  ;
  local_2a8 = "";
  pvVar7 = (iterator)0x1;
  pvVar8 = (iterator)0x0;
  local_68 = (lazy_ostream *)local_128;
  local_a8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(pCVar5 == (CBlockIndex *)0x0);
  boost::test_tools::tt_detail::report_assertion
            (&local_a8,&local_80,1,0,WARN,_cVar11,(size_t)&local_2b0,0xae);
  boost::detail::shared_count::~shared_count(&local_a8.m_message.pn);
  local_2c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/skiplist_tests.cpp"
  ;
  local_2b8 = "";
  local_2d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2c8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_11.m_end = (iterator)0xaf;
  file_11.m_begin = (iterator)&local_2c0;
  msg_11.m_end = pvVar8;
  msg_11.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_2d0,
             msg_11);
  _cVar11 = 0x63b188;
  pCVar5 = CChain::FindEarliestAtLeast(&chain,0xffffffff,0);
  local_a8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(pCVar5 == (CBlockIndex *)0x0);
  local_a8.m_message.px = (element_type *)0x0;
  local_a8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_128._0_8_ = "!chain.FindEarliestAtLeast(std::numeric_limits<unsigned int>::max(), 0)";
  local_128._8_8_ = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01389048;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_2e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/skiplist_tests.cpp"
  ;
  local_2d8 = "";
  pvVar7 = (iterator)0x1;
  pvVar8 = (iterator)0x0;
  local_68 = (lazy_ostream *)local_128;
  boost::test_tools::tt_detail::report_assertion
            (&local_a8,&local_80,1,0,WARN,_cVar11,(size_t)&local_2e0,0xaf);
  boost::detail::shared_count::~shared_count(&local_a8.m_message.pn);
  local_2f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/skiplist_tests.cpp"
  ;
  local_2e8 = "";
  local_300 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_12.m_end = (iterator)0xb0;
  file_12.m_begin = (iterator)&local_2f0;
  msg_12.m_end = pvVar8;
  msg_12.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_300,
             msg_12);
  _cVar11 = 0x63b263;
  pCVar5 = CChain::FindEarliestAtLeast(&chain,0x100000000,0);
  local_a8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(pCVar5 == (CBlockIndex *)0x0);
  local_a8.m_message.px = (element_type *)0x0;
  local_a8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_128._0_8_ =
       "!chain.FindEarliestAtLeast(int64_t(std::numeric_limits<unsigned int>::max()) + 1, 0)";
  local_128._8_8_ = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01389048;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_310 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/skiplist_tests.cpp"
  ;
  local_308 = "";
  pvVar7 = (iterator)0x1;
  pvVar8 = (iterator)0x0;
  local_68 = (lazy_ostream *)local_128;
  boost::test_tools::tt_detail::report_assertion
            (&local_a8,&local_80,1,0,WARN,_cVar11,(size_t)&local_310,0xb0);
  boost::detail::shared_count::~shared_count(&local_a8.m_message.pn);
  local_320 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/skiplist_tests.cpp"
  ;
  local_318 = "";
  local_330 = &boost::unit_test::basic_cstring<char_const>::null;
  local_328 = &boost::unit_test::basic_cstring<char_const>::null;
  file_13.m_end = (iterator)0xb2;
  file_13.m_begin = (iterator)&local_320;
  msg_13.m_end = pvVar8;
  msg_13.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_330,
             msg_13);
  local_128._8_8_ = local_128._8_8_ & 0xffffffffffffff00;
  local_128._0_8_ = &PTR__lazy_ostream_01388f08;
  local_118 = boost::unit_test::lazy_ostream::inst;
  local_110 = "";
  pCVar5 = CChain::FindEarliestAtLeast(&chain,0,-1);
  local_88 = &pCVar5->nHeight;
  local_12c = 0;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(pCVar5->nHeight == 0);
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/skiplist_tests.cpp"
  ;
  local_58 = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013890c8;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = (lazy_ostream *)&local_88;
  local_b0 = &local_12c;
  local_a8.m_message.px = (element_type *)((ulong)local_a8.m_message.px & 0xffffffffffffff00);
  local_a8._0_8_ = &PTR__lazy_ostream_013890c8;
  local_a8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  pvVar7 = (iterator)0x1;
  pvVar8 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,(lazy_ostream *)local_128,1,2,REQUIRE,0xf1caee,(size_t)&local_60,0xb2,
             &local_80,"0",&local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_340 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/skiplist_tests.cpp"
  ;
  local_338 = "";
  local_350 = &boost::unit_test::basic_cstring<char_const>::null;
  local_348 = &boost::unit_test::basic_cstring<char_const>::null;
  file_14.m_end = (iterator)0xb3;
  file_14.m_begin = (iterator)&local_340;
  msg_14.m_end = pvVar8;
  msg_14.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_350,
             msg_14);
  local_128._8_8_ = local_128._8_8_ & 0xffffffffffffff00;
  local_128._0_8_ = &PTR__lazy_ostream_01388f08;
  local_118 = boost::unit_test::lazy_ostream::inst;
  local_110 = "";
  pCVar5 = CChain::FindEarliestAtLeast(&chain,0,0);
  local_88 = &pCVar5->nHeight;
  local_12c = 0;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(pCVar5->nHeight == 0);
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/skiplist_tests.cpp"
  ;
  local_58 = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013890c8;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = (lazy_ostream *)&local_88;
  local_b0 = &local_12c;
  local_a8.m_message.px = (element_type *)((ulong)local_a8.m_message.px & 0xffffffffffffff00);
  local_a8._0_8_ = &PTR__lazy_ostream_013890c8;
  local_a8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  pvVar7 = (iterator)0x1;
  pvVar8 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,(lazy_ostream *)local_128,1,2,REQUIRE,0xf1c912,(size_t)&local_60,0xb3,
             &local_80,"0",&local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_360 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/skiplist_tests.cpp"
  ;
  local_358 = "";
  local_370 = &boost::unit_test::basic_cstring<char_const>::null;
  local_368 = &boost::unit_test::basic_cstring<char_const>::null;
  file_15.m_end = (iterator)0xb4;
  file_15.m_begin = (iterator)&local_360;
  msg_15.m_end = pvVar8;
  msg_15.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,(size_t)&local_370,
             msg_15);
  local_128._8_8_ = local_128._8_8_ & 0xffffffffffffff00;
  local_128._0_8_ = &PTR__lazy_ostream_01388f08;
  local_118 = boost::unit_test::lazy_ostream::inst;
  local_110 = "";
  pCVar5 = CChain::FindEarliestAtLeast(&chain,0,3);
  local_88 = &pCVar5->nHeight;
  local_12c = 3;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(pCVar5->nHeight == 3);
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/skiplist_tests.cpp"
  ;
  local_58 = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013890c8;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = (lazy_ostream *)&local_88;
  local_b0 = &local_12c;
  local_a8.m_message.px = (element_type *)((ulong)local_a8.m_message.px & 0xffffffffffffff00);
  local_a8._0_8_ = &PTR__lazy_ostream_013890c8;
  local_a8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  pvVar7 = (iterator)0x1;
  pvVar8 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,(lazy_ostream *)local_128,1,2,REQUIRE,0xf1cb18,(size_t)&local_60,0xb4,
             &local_80,"3",&local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_380 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/skiplist_tests.cpp"
  ;
  local_378 = "";
  local_390 = &boost::unit_test::basic_cstring<char_const>::null;
  local_388 = &boost::unit_test::basic_cstring<char_const>::null;
  file_16.m_end = (iterator)0xb5;
  file_16.m_begin = (iterator)&local_380;
  msg_16.m_end = pvVar8;
  msg_16.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,(size_t)&local_390,
             msg_16);
  local_128._8_8_ = local_128._8_8_ & 0xffffffffffffff00;
  local_128._0_8_ = &PTR__lazy_ostream_01388f08;
  local_118 = boost::unit_test::lazy_ostream::inst;
  local_110 = "";
  pCVar5 = CChain::FindEarliestAtLeast(&chain,0,8);
  local_88 = &pCVar5->nHeight;
  local_12c = 8;
  local_50.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(pCVar5->nHeight == 8);
  local_50.m_message.px = (element_type *)0x0;
  local_50.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_60 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/skiplist_tests.cpp"
  ;
  local_58 = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013890c8;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = (lazy_ostream *)&local_88;
  local_b0 = &local_12c;
  local_a8.m_message.px = (element_type *)((ulong)local_a8.m_message.px & 0xffffffffffffff00);
  local_a8._0_8_ = &PTR__lazy_ostream_013890c8;
  local_a8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_90 = &local_b0;
  pvVar7 = (iterator)0x1;
  pvVar8 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_50,(lazy_ostream *)local_128,1,2,REQUIRE,0xf1cb41,(size_t)&local_60,0xb5,
             &local_80,"8",&local_a8);
  boost::detail::shared_count::~shared_count(&local_50.m_message.pn);
  local_3a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/skiplist_tests.cpp"
  ;
  local_398 = "";
  local_3b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3a8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_17.m_end = (iterator)0xb6;
  file_17.m_begin = (iterator)&local_3a0;
  msg_17.m_end = pvVar8;
  msg_17.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_17,(size_t)&local_3b0,
             msg_17);
  _cVar11 = 0x63b8fe;
  pCVar5 = CChain::FindEarliestAtLeast(&chain,0,9);
  local_a8.m_message.px = (element_type *)0x0;
  local_a8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_128._0_8_ = "!chain.FindEarliestAtLeast(0, 9)";
  local_128._8_8_ = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01389048;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_3c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/skiplist_tests.cpp"
  ;
  local_3b8 = "";
  pvVar7 = (iterator)0x1;
  pvVar8 = (iterator)0x0;
  local_68 = (lazy_ostream *)local_128;
  local_a8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(pCVar5 == (CBlockIndex *)0x0);
  boost::test_tools::tt_detail::report_assertion
            (&local_a8,&local_80,1,0,WARN,_cVar11,(size_t)&local_3c0,0xb6);
  boost::detail::shared_count::~shared_count(&local_a8.m_message.pn);
  pCVar5 = CChain::FindEarliestAtLeast(&chain,100,2);
  local_3d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/skiplist_tests.cpp"
  ;
  local_3c8 = "";
  local_3e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3d8 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar11 = 0x63b9de;
  file_18.m_end = (iterator)0xb9;
  file_18.m_begin = (iterator)&local_3d0;
  msg_18.m_end = pvVar8;
  msg_18.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_18,(size_t)&local_3e0,
             msg_18);
  if (pCVar5->nTimeMax < 100) {
    local_a8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(class_property<bool>)0x0;
  }
  else {
    local_a8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(pCVar5->nHeight == 2);
  }
  local_a8.m_message.px = (element_type *)0x0;
  local_a8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_128._0_8_ = "ret1->nTimeMax >= 100 && ret1->nHeight == 2";
  local_128._8_8_ = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01389048;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_3f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/skiplist_tests.cpp"
  ;
  local_3e8 = "";
  pvVar7 = (iterator)0x1;
  pvVar8 = (iterator)0x0;
  local_68 = (lazy_ostream *)local_128;
  boost::test_tools::tt_detail::report_assertion
            (&local_a8,&local_80,1,0,WARN,_cVar11,(size_t)&local_3f0,0xb9);
  boost::detail::shared_count::~shared_count(&local_a8.m_message.pn);
  local_400 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/skiplist_tests.cpp"
  ;
  local_3f8 = "";
  local_410 = &boost::unit_test::basic_cstring<char_const>::null;
  local_408 = &boost::unit_test::basic_cstring<char_const>::null;
  file_19.m_end = (iterator)0xba;
  file_19.m_begin = (iterator)&local_400;
  msg_19.m_end = pvVar8;
  msg_19.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_19,(size_t)&local_410,
             msg_19);
  _cVar11 = 0x63babe;
  pCVar5 = CChain::FindEarliestAtLeast(&chain,300,9);
  local_a8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(pCVar5 == (CBlockIndex *)0x0);
  local_a8.m_message.px = (element_type *)0x0;
  local_a8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_128._0_8_ = "!chain.FindEarliestAtLeast(300, 9)";
  local_128._8_8_ = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01389048;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_420 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/skiplist_tests.cpp"
  ;
  local_418 = "";
  pvVar7 = (iterator)0x1;
  pvVar8 = (iterator)0x0;
  local_68 = (lazy_ostream *)local_128;
  boost::test_tools::tt_detail::report_assertion
            (&local_a8,&local_80,1,0,WARN,_cVar11,(size_t)&local_420,0xba);
  boost::detail::shared_count::~shared_count(&local_a8.m_message.pn);
  pCVar5 = CChain::FindEarliestAtLeast(&chain,200,4);
  local_430 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/skiplist_tests.cpp"
  ;
  local_428 = "";
  local_440 = &boost::unit_test::basic_cstring<char_const>::null;
  local_438 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar11 = 0x63bb98;
  file_20.m_end = (iterator)0xbc;
  file_20.m_begin = (iterator)&local_430;
  msg_20.m_end = pvVar8;
  msg_20.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_20,(size_t)&local_440,
             msg_20);
  if (pCVar5->nTimeMax < 200) {
    local_a8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(class_property<bool>)0x0;
  }
  else {
    local_a8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(pCVar5->nHeight == 4);
  }
  local_a8.m_message.px = (element_type *)0x0;
  local_a8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_128._0_8_ = "ret2->nTimeMax >= 200 && ret2->nHeight == 4";
  local_128._8_8_ = "";
  local_80.m_empty = false;
  local_80._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01389048;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_450 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/skiplist_tests.cpp"
  ;
  local_448 = "";
  local_68 = (lazy_ostream *)local_128;
  boost::test_tools::tt_detail::report_assertion
            (&local_a8,&local_80,1,0,WARN,_cVar11,(size_t)&local_450,0xbc);
  boost::detail::shared_count::~shared_count(&local_a8.m_message.pn);
  if (chain.vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(chain.vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)chain.vChain.
                          super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)chain.vChain.
                          super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  p_Var3 = blocks.super__List_base<CBlockIndex,_std::allocator<CBlockIndex>_>._M_impl._M_node.
           super__List_node_base._M_next;
  while (p_Var3 != (_List_node_base *)&blocks) {
    p_Var2 = (((_List_base<CBlockIndex,_std::allocator<CBlockIndex>_> *)&p_Var3->_M_next)->_M_impl).
             _M_node.super__List_node_base._M_next;
    operator_delete(p_Var3,0xa8);
    p_Var3 = p_Var2;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(findearliestatleast_edge_test)
{
    std::list<CBlockIndex> blocks;
    for (const unsigned int timeMax : {100, 100, 100, 200, 200, 200, 300, 300, 300}) {
        CBlockIndex* prev = blocks.empty() ? nullptr : &blocks.back();
        blocks.emplace_back();
        blocks.back().nHeight = prev ? prev->nHeight + 1 : 0;
        blocks.back().pprev = prev;
        blocks.back().BuildSkip();
        blocks.back().nTimeMax = timeMax;
    }

    CChain chain;
    chain.SetTip(blocks.back());

    BOOST_CHECK_EQUAL(chain.FindEarliestAtLeast(50, 0)->nHeight, 0);
    BOOST_CHECK_EQUAL(chain.FindEarliestAtLeast(100, 0)->nHeight, 0);
    BOOST_CHECK_EQUAL(chain.FindEarliestAtLeast(150, 0)->nHeight, 3);
    BOOST_CHECK_EQUAL(chain.FindEarliestAtLeast(200, 0)->nHeight, 3);
    BOOST_CHECK_EQUAL(chain.FindEarliestAtLeast(250, 0)->nHeight, 6);
    BOOST_CHECK_EQUAL(chain.FindEarliestAtLeast(300, 0)->nHeight, 6);
    BOOST_CHECK(!chain.FindEarliestAtLeast(350, 0));

    BOOST_CHECK_EQUAL(chain.FindEarliestAtLeast(0, 0)->nHeight, 0);
    BOOST_CHECK_EQUAL(chain.FindEarliestAtLeast(-1, 0)->nHeight, 0);

    BOOST_CHECK_EQUAL(chain.FindEarliestAtLeast(std::numeric_limits<int64_t>::min(), 0)->nHeight, 0);
    BOOST_CHECK_EQUAL(chain.FindEarliestAtLeast(-int64_t(std::numeric_limits<unsigned int>::max()) - 1, 0)->nHeight, 0);
    BOOST_CHECK(!chain.FindEarliestAtLeast(std::numeric_limits<int64_t>::max(), 0));
    BOOST_CHECK(!chain.FindEarliestAtLeast(std::numeric_limits<unsigned int>::max(), 0));
    BOOST_CHECK(!chain.FindEarliestAtLeast(int64_t(std::numeric_limits<unsigned int>::max()) + 1, 0));

    BOOST_CHECK_EQUAL(chain.FindEarliestAtLeast(0, -1)->nHeight, 0);
    BOOST_CHECK_EQUAL(chain.FindEarliestAtLeast(0, 0)->nHeight, 0);
    BOOST_CHECK_EQUAL(chain.FindEarliestAtLeast(0, 3)->nHeight, 3);
    BOOST_CHECK_EQUAL(chain.FindEarliestAtLeast(0, 8)->nHeight, 8);
    BOOST_CHECK(!chain.FindEarliestAtLeast(0, 9));

    CBlockIndex* ret1 = chain.FindEarliestAtLeast(100, 2);
    BOOST_CHECK(ret1->nTimeMax >= 100 && ret1->nHeight == 2);
    BOOST_CHECK(!chain.FindEarliestAtLeast(300, 9));
    CBlockIndex* ret2 = chain.FindEarliestAtLeast(200, 4);
    BOOST_CHECK(ret2->nTimeMax >= 200 && ret2->nHeight == 4);
}